

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tst_future.cpp
# Opt level: O3

void __thiscall tst_future::finallyRejected(tst_future *this)

{
  QSharedData *pQVar1;
  QSharedData *pQVar2;
  QSharedData *pQVar3;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> *pQVar4;
  undefined8 uVar5;
  PromiseResolver<int> PVar6;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> QVar7;
  PromiseResolver<void> PVar8;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<int>_> QVar9;
  bool bVar10;
  char cVar11;
  PromiseData<int> *pPVar12;
  PromiseData<int> *this_00;
  char *pcVar13;
  char *pcVar14;
  QSharedData *pQVar15;
  QPromiseReject<int> *in_R8;
  char *reject;
  QByteArrayView QVar16;
  QStringView QVar17;
  QStringView QVar18;
  _Any_data local_1a8;
  undefined **local_198;
  PromiseData<int> *local_190;
  PromiseResolver<int> resolver_1;
  QPromise<int> local_168;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_158;
  PromiseResolver<int> resolver_2;
  _Any_data local_148;
  _Manager_type local_138;
  _Invoker_type p_Stack_130;
  QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> local_120;
  QString error;
  PromiseResolver<void> resolver;
  Type input;
  _Any_data local_a8;
  code *local_98;
  code *pcStack_90;
  _Any_data local_88;
  code *local_78;
  code *pcStack_70;
  _func_int **local_60;
  _func_int **local_58;
  _Any_data local_50;
  code *local_40;
  
  local_1a8._0_4_ = 0x2a;
  QtPromise::resolve<int>((QtPromise *)&input,(int *)local_1a8._M_pod_data);
  QVar9 = input.super_QPromiseBase<int>.m_d;
  if (input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((input.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>
              ).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  pPVar12 = (PromiseData<int> *)operator_new(0x58);
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> **)
   &((QVector<Catcher> *)&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
  *(qsizetype *)
   &((QVector<Catcher> *)
    &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size)->d = 0;
  *(qsizetype *)
   &((QVector<Handler> *)
    &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size)->d = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> **)
   &((QVector<Handler> *)&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data = (exception_ptr)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_001307a8;
  QReadWriteLock::QReadWriteLock
            (&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> **)
   &((QVector<Handler> *)&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(qsizetype *)
   &((QVector<Handler> *)
    &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size)->d = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> **)
   &((QVector<Catcher> *)&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
  *(qsizetype *)
   &((QVector<Catcher> *)
    &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size)->d = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data = (exception_ptr)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_00130730;
  LOCK();
  pQVar1 = &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  pQVar1->ref = (QAtomicInt)((int)pQVar1->ref + 1);
  UNLOCK();
  LOCK();
  pQVar1 = &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  pQVar1->ref = (QAtomicInt)((int)pQVar1->ref + 1);
  UNLOCK();
  pQVar1 = &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  local_148._M_unused._M_object = &PTR__QPromiseBase_001306f8;
  local_148._8_8_ = pPVar12;
  QtPromisePrivate::PromiseResolver<void>::PromiseResolver(&resolver,(QPromise<void> *)&local_148);
  local_148._M_unused._M_object = &PTR__QPromiseBase_00130570;
  if ((PromiseData<int> *)local_148._8_8_ != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar15 = (QSharedData *)(local_148._8_8_ + 8);
    (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<int> *)local_148._8_8_ != (PromiseData<int> *)0x0)) {
      (**(code **)(*(long *)local_148._8_8_ + 8))();
    }
  }
  PVar8.m_d.d = resolver.m_d.d;
  if (resolver.m_d.d == (Data *)0x0) {
    local_1a8._M_unused._M_object = (Data *)0x0;
LAB_00110169:
    local_1a8._8_8_ = (Data *)0x0;
    bVar10 = true;
  }
  else {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    if (resolver.m_d.d == (Data *)0x0) {
      local_1a8._M_unused._M_object = (void *)resolver.m_d.d;
      LOCK();
      iRam0000000000000000 = iRam0000000000000000 + 1;
      UNLOCK();
      goto LAB_00110169;
    }
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_1a8._M_unused._M_object = (void *)resolver.m_d.d;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    local_1a8._8_8_ = resolver.m_d.d;
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + 1;
    UNLOCK();
    bVar10 = false;
  }
  uVar5 = local_1a8._8_8_;
  local_78 = (code *)0x0;
  pcStack_70 = (code *)0x0;
  local_88._M_unused._M_object = (void *)0x0;
  local_88._8_8_ = 0;
  local_88._M_unused._M_object = operator_new(0x18);
  *(void **)local_88._M_unused._0_8_ = local_1a8._M_unused._M_object;
  if ((Data *)local_1a8._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_1a8._M_unused._0_8_ = *local_1a8._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_88._M_unused._0_8_ + 8) = local_1a8._8_8_;
  if ((Data *)local_1a8._8_8_ == (Data *)0x0) {
    pcStack_70 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)local_1a8._8_8_ = *(int *)local_1a8._8_8_ + 1;
    UNLOCK();
    pcStack_70 = std::
                 _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
                 ::_M_invoke;
    local_78 = std::
               _Function_handler<void_(const_int_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:270:16)>
               ::_M_manager;
    if ((Data *)local_1a8._8_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_1a8._8_8_ = *(int *)local_1a8._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_1a8._8_8_ == 0) {
        operator_delete((void *)local_1a8._8_8_,0x10);
      }
    }
  }
  if ((Data *)local_1a8._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_1a8._M_unused._0_8_ = *local_1a8._M_unused._M_object + -1;
    UNLOCK();
    if (*local_1a8._M_unused._M_object == 0) {
      operator_delete(local_1a8._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            (&(QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_int_&)> *)&local_88);
  if (local_78 != (code *)0x0) {
    (*local_78)(&local_88,&local_88,__destroy_functor);
  }
  local_1a8._M_unused._M_object = (void *)PVar8.m_d.d;
  if (PVar8.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar8.m_d.d = *(int *)PVar8.m_d.d + 1;
    UNLOCK();
  }
  if (!bVar10) {
    LOCK();
    *(int *)uVar5 = *(int *)uVar5 + 1;
    UNLOCK();
  }
  local_98 = (code *)0x0;
  pcStack_90 = (code *)0x0;
  local_a8._M_unused._M_object = (void *)0x0;
  local_a8._8_8_ = 0;
  local_1a8._8_8_ = uVar5;
  local_a8._M_unused._M_object = operator_new(0x18);
  *(void **)local_a8._M_unused._0_8_ = local_1a8._M_unused._M_object;
  if ((Data *)local_1a8._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_1a8._M_unused._0_8_ = *local_1a8._M_unused._M_object + 1;
    UNLOCK();
  }
  *(undefined8 *)((long)local_a8._M_unused._0_8_ + 8) = local_1a8._8_8_;
  if ((Data *)local_1a8._8_8_ == (Data *)0x0) {
    pcStack_90 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
  }
  else {
    LOCK();
    *(int *)local_1a8._8_8_ = *(int *)local_1a8._8_8_ + 1;
    UNLOCK();
    pcStack_90 = std::
                 _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
                 ::_M_invoke;
    local_98 = std::
               _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:355:16)>
               ::_M_manager;
    if ((Data *)local_1a8._8_8_ != (Data *)0x0) {
      LOCK();
      *(int *)local_1a8._8_8_ = *(int *)local_1a8._8_8_ + -1;
      UNLOCK();
      if (*(int *)local_1a8._8_8_ == 0) {
        operator_delete((void *)local_1a8._8_8_,0x10);
      }
    }
  }
  if ((Data *)local_1a8._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_1a8._M_unused._0_8_ = *local_1a8._M_unused._M_object + -1;
    UNLOCK();
    if (*local_1a8._M_unused._M_object == 0) {
      operator_delete(local_1a8._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            (&(QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_a8);
  if (local_98 != (code *)0x0) {
    (*local_98)(&local_a8,&local_a8,__destroy_functor);
  }
  if (!bVar10) {
    LOCK();
    *(int *)uVar5 = *(int *)uVar5 + -1;
    UNLOCK();
    if (*(int *)uVar5 == 0) {
      operator_delete((void *)uVar5,0x10);
    }
  }
  if (PVar8.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)PVar8.m_d.d = *(int *)PVar8.m_d.d + -1;
    UNLOCK();
    if (*(int *)PVar8.m_d.d == 0) {
      operator_delete((void *)PVar8.m_d.d,0x10);
    }
  }
  if (resolver.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver.m_d.d = *(int *)resolver.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver.m_d.d == 0) {
      operator_delete((void *)resolver.m_d.d,0x10);
    }
  }
  bVar10 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                     (&(QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  if (!bVar10) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              (&(QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>);
  }
  pQVar15 = &((QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  LOCK();
  pQVar2 = &((QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar2->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  this_00 = (PromiseData<int> *)operator_new(0x68);
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data = (exception_ptr)0x0;
  ((PromiseDataBase<int,_void_(const_int_&)> *)&this_00->m_value)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> **)
   &((QVector<Catcher> *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
  *(qsizetype *)
   &((QVector<Catcher> *)
    &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size)->d = 0;
  *(qsizetype *)
   &((QVector<Handler> *)
    &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size)->d = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> **)
   &((QVector<Handler> *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  *(undefined8 *)&((PromiseDataBase<int,_void_(const_int_&)> *)&this_00->m_value)->super_QSharedData
       = 0;
  local_58 = (_func_int **)&PTR__PromiseDataBase_001308a8;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseDataBase_001308a8;
  QReadWriteLock::QReadWriteLock
            (&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> **)
   &((QVector<Handler> *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(qsizetype *)
   &((QVector<Handler> *)
    &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size)->d = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = 0;
  *(pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> **)
   &((QVector<Catcher> *)&(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr
    )->d = (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *
           )0x0;
  *(qsizetype *)
   &((QVector<Catcher> *)
    &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size)->d = 0;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data = (exception_ptr)0x0;
  local_60 = (_func_int **)&PTR__PromiseData_00130840;
  (this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)&PTR__PromiseData_00130840;
  ((PromiseDataBase<int,_void_(const_int_&)> *)&this_00->m_value)->_vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&((PromiseDataBase<int,_void_(const_int_&)> *)&this_00->m_value)->super_QSharedData
       = 0;
  LOCK();
  pQVar2 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  pQVar2->ref = (QAtomicInt)((int)pQVar2->ref + 1);
  UNLOCK();
  LOCK();
  pQVar2 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  pQVar2->ref = (QAtomicInt)((int)pQVar2->ref + 1);
  UNLOCK();
  pQVar2 = &(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  local_148._M_unused._M_object = &PTR__QPromiseBase_00130808;
  local_148._8_8_ = this_00;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_1,(QPromise<int> *)&local_148);
  local_148._M_unused._M_object = &PTR__QPromiseBase_001305a0;
  if ((PromiseData<int> *)local_148._8_8_ != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar3 = (QSharedData *)(local_148._8_8_ + 8);
    (pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       ((PromiseData<int> *)local_148._8_8_ != (PromiseData<int> *)0x0)) {
      (**(code **)(*(long *)local_148._8_8_ + 8))();
    }
  }
  if (resolver_1.m_d.d == (Data *)0x0) {
    error.d.d = (Data *)0x0;
    local_168.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
    error.d.d = (Data *)resolver_1.m_d.d;
    if (resolver_1.m_d.d == (Data *)0x0) {
      local_168.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)0x0;
LAB_0011051b:
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
      if ((Data *)local_168.super_QPromiseBase<int>._vptr_QPromiseBase == (Data *)0x0)
      goto LAB_00110530;
    }
    else {
      LOCK();
      *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
      UNLOCK();
      local_168.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)resolver_1.m_d.d;
      if (resolver_1.m_d.d != (Data *)0x0) goto LAB_0011051b;
    }
    LOCK();
    (((QSharedData *)local_168.super_QPromiseBase<int>._vptr_QPromiseBase)->ref).
    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i
         = (((QSharedData *)local_168.super_QPromiseBase<int>._vptr_QPromiseBase)->ref).
           super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
           super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
LAB_00110530:
  local_190 = QVar9.d;
  LOCK();
  pQVar3 = &((QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar3->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_198 = &PTR__QPromiseBase_00130808;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)(Data *)0x0;
  local_1a8._M_unused._M_object = error.d.d;
  local_1a8._8_8_ = local_168.super_QPromiseBase<int>._vptr_QPromiseBase;
  resolver.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<void>::Data>)
       operator_new(0x20);
  *(void **)resolver.m_d.d = local_1a8._M_unused._M_object;
  if ((Data *)local_1a8._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_1a8._M_unused._0_8_ = *local_1a8._M_unused._M_object + 1;
    UNLOCK();
  }
  ((Data *)resolver.m_d.d)->promise = (QPromise<void> *)local_1a8._8_8_;
  if ((Data *)local_1a8._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_1a8._8_8_ = *(int *)local_1a8._8_8_ + 1;
    UNLOCK();
  }
  *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_001305a0;
  ((Data *)((long)resolver.m_d.d + 0x10))->promise = (QPromise<void> *)local_190;
  if (local_190 == (PromiseData<int> *)0x0) {
    *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_00130808;
    local_198 = &PTR__QPromiseBase_001305a0;
  }
  else {
    LOCK();
    pQVar4 = (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> *)
             &(local_190->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    *(int *)&pQVar4->d = *(int *)&pQVar4->d + 1;
    UNLOCK();
    *(undefined ***)((long)resolver.m_d.d + 0x10) = &PTR__QPromiseBase_00130808;
    local_198 = &PTR__QPromiseBase_001305a0;
    if (local_190 != (PromiseData<int> *)0x0) {
      LOCK();
      pQVar4 = (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseData<void>_> *)
               &(local_190->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
      *(int *)&pQVar4->d = *(int *)&pQVar4->d + -1;
      UNLOCK();
      if ((*(int *)&pQVar4->d == 0) && (local_190 != (PromiseData<int> *)0x0)) {
        (*(local_190->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])();
      }
    }
  }
  if ((Data *)local_1a8._8_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_1a8._8_8_ = *(int *)local_1a8._8_8_ + -1;
    UNLOCK();
    if (*(int *)local_1a8._8_8_ == 0) {
      operator_delete((void *)local_1a8._8_8_,0x10);
    }
  }
  if ((Data *)local_1a8._M_unused._0_8_ != (Data *)0x0) {
    LOCK();
    *(int *)local_1a8._M_unused._0_8_ = *local_1a8._M_unused._M_object + -1;
    UNLOCK();
    if (*local_1a8._M_unused._M_object == 0) {
      operator_delete(local_1a8._M_unused._M_object,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addHandler
            ((PromiseDataBase<void,_void_()> *)pPVar12,(function<void_()> *)&resolver);
  std::
  _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:286:16)>
  ::_M_manager((_Any_data *)&resolver,(_Any_data *)&resolver,__destroy_functor);
  QtPromisePrivate::PromiseCatcher<void,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50,
             (PromiseCatcher<void,decltype(nullptr),void> *)0x0,&error,
             (QPromiseResolve<int> *)&local_168,in_R8);
  QtPromisePrivate::PromiseDataBase<void,_void_()>::addCatcher
            ((PromiseDataBase<void,_void_()> *)pPVar12,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_50);
  if (local_40 != (code *)0x0) {
    (*local_40)(&local_50,&local_50,__destroy_functor);
  }
  if ((Data *)local_168.super_QPromiseBase<int>._vptr_QPromiseBase != (Data *)0x0) {
    LOCK();
    (((QSharedData *)local_168.super_QPromiseBase<int>._vptr_QPromiseBase)->ref).
    super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          (((QSharedData *)local_168.super_QPromiseBase<int>._vptr_QPromiseBase)->ref).
          super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>
         + -1);
    UNLOCK();
    if ((__int_type)
        (((QSharedData *)local_168.super_QPromiseBase<int>._vptr_QPromiseBase)->ref).
        super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>
        == 0) {
      operator_delete(local_168.super_QPromiseBase<int>._vptr_QPromiseBase,0x10);
    }
  }
  if (error.d.d != (Data *)0x0) {
    LOCK();
    ((error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(error.d.d,0x10);
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  bVar10 = QtPromisePrivate::PromiseDataBase<void,_void_()>::isPending
                     ((PromiseDataBase<void,_void_()> *)pPVar12);
  if (!bVar10) {
    QtPromisePrivate::PromiseDataBase<void,_void_()>::dispatch
              ((PromiseDataBase<void,_void_()> *)pPVar12);
  }
  LOCK();
  (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(QVar9.d)
    ;
  }
  LOCK();
  pQVar1->ref = (QAtomicInt)((int)pQVar1->ref + -1);
  UNLOCK();
  if (((QAtomicInteger<int>)pQVar1->ref).super_QAtomicInteger<int> == (QAtomicInteger<int>)0x0) {
    (*(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(pPVar12);
  }
  LOCK();
  (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*((QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(QVar9.d)
    ;
  }
  QVar9.d = input.super_QPromiseBase<int>.m_d.d;
  bVar10 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                     (&(input.super_QPromiseBase<int>.m_d.d)->
                       super_PromiseDataBase<int,_void_(const_int_&)>);
  bVar10 = (bool)(~bVar10 &
                 ((QVar9.d)->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data.
                 _M_exception_object == (void *)0x0);
  local_148._M_pod_data[0] = 1;
  local_1a8._M_pod_data[0] = bVar10;
  pcVar13 = QTest::toString<bool>((bool *)local_1a8._M_pod_data);
  pcVar14 = QTest::toString<bool>((bool *)local_148._M_pod_data);
  cVar11 = QTest::compare_helper
                     (bVar10,"Compared values are not the same",pcVar13,pcVar14,
                      "input.isFulfilled()","true",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                      ,0x161);
  if (cVar11 == '\0') goto LAB_00110c64;
  bVar10 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                     ((PromiseDataBase<int,_void_(const_int_&)> *)this_00);
  local_148._M_pod_data[0] = 1;
  local_1a8._M_pod_data[0] = bVar10;
  pcVar13 = QTest::toString<bool>((bool *)local_1a8._M_pod_data);
  pcVar14 = QTest::toString<bool>((bool *)local_148._M_pod_data);
  reject = "output.isPending()";
  cVar11 = QTest::compare_helper
                     (bVar10,"Compared values are not the same",pcVar13,pcVar14,"output.isPending()"
                      ,"true",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                      ,0x162);
  if (cVar11 == '\0') goto LAB_00110c64;
  error.d.d = (Data *)0x0;
  error.d.ptr = (char16_t *)0x0;
  error.d.size = 0;
  pPVar12 = (PromiseData<int> *)operator_new(0x68);
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase =
       (_func_int **)0x0;
  *(undefined8 *)&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar12->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  *(undefined8 *)&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock = 0;
  *(undefined8 *)&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = 0;
  (pPVar12->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = local_58;
  QReadWriteLock::QReadWriteLock
            (&(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_lock,0);
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_settled = false;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.d = (Data *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_handlers.d.size = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.d = (Data *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.ptr =
       (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)0x0
  ;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_catchers.d.size = 0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data._M_exception_object =
       (void *)0x0;
  (pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase = local_60;
  (pPVar12->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)0x0;
  (pPVar12->m_value).m_data.super___shared_ptr<int,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  LOCK();
  pQVar1 = &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  pQVar15 = &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  LOCK();
  pQVar1 = &(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
  (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  local_168.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_00130808;
  local_168.super_QPromiseBase<int>.m_d.d = pPVar12;
  QtPromisePrivate::PromiseResolver<int>::PromiseResolver(&resolver_2,&local_168);
  local_168.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001305a0;
  if (local_168.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_168.super_QPromiseBase<int>.m_d.d)->
              super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (local_168.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((local_168.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  if (resolver_2.m_d.d == (Data *)0x0) {
    local_158.d = (Data *)0x0;
LAB_0011094f:
    local_120.d = (Data *)0x0;
  }
  else {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    local_158 = resolver_2.m_d.d;
    if (resolver_2.m_d.d == (Data *)0x0) goto LAB_0011094f;
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + 1;
    UNLOCK();
    local_120 = resolver_2.m_d.d;
  }
  QtPromisePrivate::PromiseHandler<int,decltype(nullptr),void>::
  create<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
            ((function<void_(const_int_&)> *)&local_1a8,
             (PromiseHandler<int,decltype(nullptr),void> *)0x0,&local_158,
             (QPromiseResolve<int> *)&local_120,(QPromiseReject<int> *)reject);
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addHandler
            ((PromiseDataBase<int,_void_(const_int_&)> *)this_00,
             (function<void_(const_int_&)> *)&local_1a8);
  if (local_198 != (undefined **)0x0) {
    (*(code *)local_198)(&local_1a8,&local_1a8,__destroy_functor);
  }
  QVar7.d = local_120.d;
  resolver_1.m_d.d =
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)
       (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)local_158.d;
  if (local_158.d != (Data *)0x0) {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  if (local_120.d != (Data *)0x0) {
    LOCK();
    ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_148._M_unused._M_object = (_func_int **)0x0;
  local_148._8_8_ = (PromiseData<int> *)0x0;
  local_138 = (_Manager_type)0x0;
  p_Stack_130 = (_Invoker_type)0x0;
  local_148._M_unused._M_object = operator_new(0x18);
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  local_148._M_unused._0_8_)->d = (Data *)resolver_1.m_d.d;
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + 1;
    UNLOCK();
  }
  ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
  ((long)local_148._M_unused._0_8_ + 8))->d = QVar7.d;
  if (QVar7.d == (Data *)0x0) {
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_148._M_unused._0_8_ + 0x10))->d = (Data *)&error;
    p_Stack_130 = std::
                  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                  ::_M_invoke;
    local_138 = std::
                _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                ::_M_manager;
  }
  else {
    LOCK();
    ((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>
         ._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
    ((QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data> *)
    ((long)local_148._M_unused._0_8_ + 0x10))->d = (Data *)&error;
    p_Stack_130 = std::
                  _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                  ::_M_invoke;
    local_138 = std::
                _Function_handler<void_(const_QtPromisePrivate::PromiseError_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/include/../src/qtpromise/qpromise_p.h:334:16)>
                ::_M_manager;
    if (QVar7.d != (Data *)0x0) {
      LOCK();
      ((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
      _q_value.super___atomic_base<int>._M_i =
           ((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
           super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if (((QVar7.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
        operator_delete(QVar7.d,0x10);
      }
    }
  }
  if (resolver_1.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_1.m_d.d = *(int *)resolver_1.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_1.m_d.d == 0) {
      operator_delete((void *)resolver_1.m_d.d,0x10);
    }
  }
  QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::addCatcher
            ((PromiseDataBase<int,_void_(const_int_&)> *)this_00,
             (function<void_(const_QtPromisePrivate::PromiseError_&)> *)&local_148);
  if (local_138 != (_Manager_type)0x0) {
    (*local_138)(&local_148,&local_148,__destroy_functor);
  }
  if (local_120.d != (Data *)0x0) {
    LOCK();
    ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int> =
         (__atomic_base<int>)
         ((__int_type)
          ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
          super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> + -1);
    UNLOCK();
    if ((__int_type)
        ((local_120.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int> == 0) {
      operator_delete(local_120.d,0x10);
    }
  }
  if (local_158.d != (Data *)0x0) {
    LOCK();
    ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value.super___atomic_base<int>._M_i =
         ((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
         super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_158.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
        super_QBasicAtomicInteger<int>._q_value.super___atomic_base<int>._M_i == 0) {
      operator_delete(local_158.d,0x10);
    }
  }
  if (resolver_2.m_d.d != (Data *)0x0) {
    LOCK();
    *(int *)resolver_2.m_d.d = *(int *)resolver_2.m_d.d + -1;
    UNLOCK();
    if (*(int *)resolver_2.m_d.d == 0) {
      operator_delete((void *)resolver_2.m_d.d,0x10);
    }
  }
  bVar10 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                     ((PromiseDataBase<int,_void_(const_int_&)> *)this_00);
  if (!bVar10) {
    QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::dispatch
              ((PromiseDataBase<int,_void_(const_int_&)> *)this_00);
  }
  bVar10 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                     ((PromiseDataBase<int,_void_(const_int_&)> *)pPVar12);
  while (bVar10 != false) {
    QCoreApplication::processEvents();
    QCoreApplication::sendPostedEvents((QObject *)0x0,0x34);
    bVar10 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                       ((PromiseDataBase<int,_void_(const_int_&)> *)pPVar12);
  }
  LOCK();
  (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + 1;
  UNLOCK();
  LOCK();
  (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(pPVar12);
  }
  LOCK();
  (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
  super___atomic_base<int>._M_i =
       (pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
       super___atomic_base<int>._M_i + -1;
  UNLOCK();
  if ((pQVar15->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
      super___atomic_base<int>._M_i == 0) {
    (*(pPVar12->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(pPVar12);
  }
  bVar10 = QtPromisePrivate::PromiseDataBase<int,_void_(const_int_&)>::isPending
                     ((PromiseDataBase<int,_void_(const_int_&)> *)this_00);
  bVar10 = (bool)(~bVar10 &
                 ((void *)(this_00->super_PromiseDataBase<int,_void_(const_int_&)>).m_error.m_data).
                 _M_exception_object != (void *)0x0);
  resolver_1.m_d.d._0_1_ = bVar10;
  local_168.super_QPromiseBase<int>._vptr_QPromiseBase =
       (_func_int **)CONCAT71(local_168.super_QPromiseBase<int>._vptr_QPromiseBase._1_7_,1);
  pcVar13 = QTest::toString<bool>((bool *)&resolver_1);
  pcVar14 = QTest::toString<bool>((bool *)&local_168);
  cVar11 = QTest::compare_helper
                     (bVar10,"Compared values are not the same",pcVar13,pcVar14,
                      "output.isRejected()","true",
                      "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                      ,0x16c);
  if (cVar11 != '\0') {
    QVar16.m_data = (storage_type *)((long)&iRam0000000000000000 + 3);
    QVar16.m_size = (qsizetype)&resolver_1;
    QString::fromUtf8(QVar16);
    PVar6 = resolver_1;
    QVar17.m_data = error.d.ptr;
    QVar17.m_size = error.d.size;
    QVar18.m_data = (storage_type_conflict *)QVar7.d;
    QVar18.m_size = (qsizetype)&error;
    QTest::qCompare(QVar17,QVar18,"error","QString{\"foo\"}",
                    "/workspace/llm4binary/github/license_c_cmakelists/simonbrunel[P]qtpromise/tests/auto/qtpromise/future/tst_future.cpp"
                    ,0x16d);
    if (PVar6.m_d.d != (Data *)0x0) {
      LOCK();
      *(int *)PVar6.m_d.d = *(int *)PVar6.m_d.d + -1;
      UNLOCK();
      if (*(int *)PVar6.m_d.d == 0) {
        QArrayData::deallocate((QArrayData *)PVar6.m_d.d,2,8);
      }
    }
  }
  if (error.d.d != (Data *)0x0) {
    LOCK();
    ((error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((error.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(error.d.d)->super_QArrayData,2,8);
    }
  }
LAB_00110c64:
  LOCK();
  pQVar2->ref = (QAtomicInt)((int)pQVar2->ref + -1);
  UNLOCK();
  if (((QAtomicInteger<int>)pQVar2->ref).super_QAtomicInteger<int> == (QAtomicInteger<int>)0x0) {
    (*(this_00->super_PromiseDataBase<int,_void_(const_int_&)>)._vptr_PromiseDataBase[1])(this_00);
  }
  input.super_QPromiseBase<int>._vptr_QPromiseBase = (_func_int **)&PTR__QPromiseBase_001305a0;
  if (input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((input.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>
              ).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i == 0) &&
       (input.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0)) {
      (*((input.super_QPromiseBase<int>.m_d.d)->super_PromiseDataBase<int,_void_(const_int_&)>).
        _vptr_PromiseDataBase[1])();
    }
  }
  return;
}

Assistant:

void tst_future::finallyRejected()
{
    auto input = QtPromise::resolve(42);
    auto output = input.finally([]() {
        return QtConcurrent::run([]() {
            throw MyException{"foo"};
        });
    });

    Q_STATIC_ASSERT((std::is_same<decltype(output), QtPromise::QPromise<int>>::value));

    QCOMPARE(input.isFulfilled(), true);
    QCOMPARE(output.isPending(), true);

    QString error;
    output
        .fail([&](const MyException& e) {
            error = e.error();
            return -1;
        })
        .wait();

    QCOMPARE(output.isRejected(), true);
    QCOMPARE(error, QString{"foo"});
}